

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O0

void __thiscall QTlsPrivate::TlsKeyOpenSSL::clear(TlsKeyOpenSSL *this,bool deep)

{
  byte bVar1;
  KeyAlgorithm KVar2;
  byte in_SIL;
  TlsKeyBase *in_RDI;
  
  bVar1 = in_SIL & 1;
  in_RDI->keyIsNull = true;
  KVar2 = TlsKeyBase::algorithm(in_RDI);
  if ((KVar2 == Rsa) && (*(long *)(in_RDI + 1) != 0)) {
    if (bVar1 != 0) {
      q_RSA_free((RSA *)0x14cb3c);
    }
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  KVar2 = TlsKeyBase::algorithm(in_RDI);
  if ((KVar2 == Dsa) && (*(long *)(in_RDI + 1) != 0)) {
    if (bVar1 != 0) {
      q_DSA_free((DSA *)0x14cb75);
    }
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  KVar2 = TlsKeyBase::algorithm(in_RDI);
  if ((KVar2 == Dh) && (*(long *)(in_RDI + 1) != 0)) {
    if (bVar1 != 0) {
      q_DH_free((DH *)0x14cbae);
    }
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  KVar2 = TlsKeyBase::algorithm(in_RDI);
  if ((KVar2 == Ec) && (*(long *)(in_RDI + 1) != 0)) {
    if (bVar1 != 0) {
      q_EC_KEY_free((EC_KEY *)0x14cbe7);
    }
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  KVar2 = TlsKeyBase::algorithm(in_RDI);
  if ((KVar2 == Opaque) && (*(long *)(in_RDI + 1) != 0)) {
    if (bVar1 != 0) {
      q_EVP_PKEY_free((EVP_PKEY *)0x14cc20);
    }
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  if (*(long *)(in_RDI + 1) != 0) {
    q_EVP_PKEY_free((EVP_PKEY *)0x14cc44);
    *(undefined8 *)(in_RDI + 1) = 0;
  }
  return;
}

Assistant:

void TlsKeyOpenSSL::clear(bool deep)
{
    keyIsNull = true;

#ifndef OPENSSL_NO_DEPRECATED_3_0
    if (algorithm() == QSsl::Rsa && rsa) {
        if (deep)
            q_RSA_free(rsa);
        rsa = nullptr;
    }
    if (algorithm() == QSsl::Dsa && dsa) {
        if (deep)
            q_DSA_free(dsa);
        dsa = nullptr;
    }
    if (algorithm() == QSsl::Dh && dh) {
        if (deep)
            q_DH_free(dh);
        dh = nullptr;
    }
#ifndef OPENSSL_NO_EC
    if (algorithm() == QSsl::Ec && ec) {
       if (deep)
            q_EC_KEY_free(ec);
       ec = nullptr;
    }
#endif
#endif // OPENSSL_NO_DEPRECATED_3_0

    if (algorithm() == QSsl::Opaque && opaque) {
        if (deep)
            q_EVP_PKEY_free(opaque);
        opaque = nullptr;
    }

    if (genericKey) {
        // None of the above cleared it. genericKey is either
        // initialised by PEM read operation, or from X509, and
        // we are the owners and not sharing. So we free it.
        q_EVP_PKEY_free(genericKey);
        genericKey = nullptr;
    }
}